

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O3

void rw::Matrix::invertOrthonormal(Matrix *dst,Matrix *src)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = (float)(src->right).x;
  (dst->right).x = (float32)fVar1;
  (dst->right).y = (src->up).x;
  (dst->right).z = (src->at).x;
  fVar2 = (float)(src->right).y;
  (dst->up).x = (float32)fVar2;
  fVar3 = (float)(src->up).y;
  (dst->up).y = (float32)fVar3;
  (dst->up).z = (src->at).y;
  fVar4 = (float)(src->right).z;
  (dst->at).x = (float32)fVar4;
  fVar5 = (float)(src->up).z;
  (dst->at).y = (float32)fVar5;
  fVar6 = (float)(src->at).z;
  (dst->at).z = (float32)fVar6;
  fVar7 = (float)(src->pos).y;
  fVar8 = (float)(src->pos).z;
  (dst->pos).x = (float32)-(fVar4 * fVar8 + fVar1 * (float)(src->pos).x + fVar2 * fVar7);
  fVar1 = (float)(src->pos).x;
  (dst->pos).y = (float32)-(fVar5 * fVar8 + (float)(src->up).x * fVar1 + fVar7 * fVar3);
  (dst->pos).z = (float32)-(fVar8 * fVar6 +
                           fVar1 * (float)(src->at).x + (float)(src->pos).y * (float)(src->at).y);
  dst->flags = 3;
  return;
}

Assistant:

void
Matrix::invertOrthonormal(Matrix *dst, const Matrix *src)
{
	dst->right.x = src->right.x;
	dst->right.y = src->up.x;
	dst->right.z = src->at.x;
	dst->up.x = src->right.y;
	dst->up.y = src->up.y;
	dst->up.z = src->at.y;
	dst->at.x = src->right.z;
	dst->at.y = src->up.z;
	dst->at.z = src->at.z;
	dst->pos.x = -(src->pos.x*src->right.x +
	               src->pos.y*src->right.y +
	               src->pos.z*src->right.z);
	dst->pos.y = -(src->pos.x*src->up.x +
	               src->pos.y*src->up.y +
	               src->pos.z*src->up.z);
	dst->pos.z = -(src->pos.x*src->at.x +
	               src->pos.y*src->at.y +
	               src->pos.z*src->at.z);
	dst->flags = TYPEORTHONORMAL;
}